

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O2

void rasterizeTriangle(Vec3f *points,Vec3f *norms,Vec2f *text,
                      vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *framebuffer,
                      vector<float,_std::allocator<float>_> *zBuffer)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  int y;
  int y_00;
  int x;
  int x_00;
  float fVar6;
  float fVar7;
  Vec3f local_cc;
  Vec3f *local_c0;
  Vec3f *local_b8;
  Vec2f *local_b0;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *local_a8;
  vector<float,_std::allocator<float>_> *local_a0;
  Vec3f local_98;
  Vec3f local_88;
  Vec3f local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Vec3f local_40;
  
  fVar1 = points->z;
  local_78.z = points[1].z - fVar1;
  local_68._0_4_ = points->x;
  local_68._4_4_ = points->y;
  uVar2 = points[1].x;
  uVar4 = points[1].y;
  local_78.y = (float)uVar4 - (float)local_68._4_4_;
  local_78.x = (float)uVar2 - (float)local_68;
  local_40.z = points[2].z - fVar1;
  fVar3 = points[2].x;
  fVar5 = points[2].y;
  local_40.y = fVar5 - (float)local_68._4_4_;
  local_40.x = fVar3 - (float)local_68;
  fVar7 = fVar3;
  if ((float)uVar2 <= fVar3) {
    fVar7 = (float)uVar2;
  }
  if ((float)local_68 <= fVar7) {
    fVar7 = (float)local_68;
  }
  x_00 = (int)fVar7;
  if (fVar3 <= (float)uVar2) {
    fVar3 = (float)uVar2;
  }
  if (fVar3 <= (float)local_68) {
    fVar3 = (float)local_68;
  }
  fVar7 = fVar5;
  if ((float)uVar4 <= fVar5) {
    fVar7 = (float)uVar4;
  }
  uStack_60 = 0;
  if ((float)local_68._4_4_ <= fVar7) {
    fVar7 = (float)local_68._4_4_;
  }
  if (fVar5 <= (float)uVar4) {
    fVar5 = (float)uVar4;
  }
  if (fVar5 <= (float)local_68._4_4_) {
    fVar5 = (float)local_68._4_4_;
  }
  local_c0 = points;
  local_b8 = norms;
  local_b0 = text;
  local_a8 = framebuffer;
  local_a0 = zBuffer;
  local_58 = (float)local_68._4_4_;
  fStack_54 = (float)local_68._4_4_;
  fStack_50 = (float)local_68._4_4_;
  fStack_4c = (float)local_68._4_4_;
  for (; x_00 <= (int)fVar3; x_00 = x_00 + 1) {
    fVar6 = (float)local_68 - (float)x_00;
    for (y_00 = (int)fVar7; y_00 <= (int)fVar5; y_00 = y_00 + 1) {
      local_cc.y = local_58 - (float)y_00;
      local_cc.x = fVar6;
      local_cc.z = fVar1 + -1.0;
      getBarycentricCoordinates(&local_78,&local_40,&local_cc);
      local_88.x = local_98.x;
      local_88.y = local_98.y;
      local_88.z = local_98.z;
      if (((0.0 < local_98.x) && (0.0 < local_98.y)) && (0.0 < local_98.z)) {
        updateZBuffer(x_00,y_00,local_c0,local_b0,local_b8,&local_88,local_a8,local_a0);
      }
    }
  }
  return;
}

Assistant:

void rasterizeTriangle(Vec3f points[], const Vec3f norms[], Vec2f text[], std::vector<Vec3f> &framebuffer,
                       std::vector<float> &zBuffer) {
    Vec3f A, B, C, P, AB, AC, PA, barycenter;
    int minX, maxX, minY, maxY;

    A = points[0];
    B = points[1];
    C = points[2];

    AB = Vec3f(
        B.x - A.x,
        B.y - A.y,
        B.z - A.z
    );

    AC = Vec3f(
            C.x - A.x,
            C.y - A.y,
            C.z - A.z
    );

    // finding bounding box
    minX = std::min(A.x, std::min(B.x, C.x));
    maxX = std::max(A.x, std::max(B.x, C.x));
    minY = std::min(A.y, std::min(B.y, C.y));
    maxY = std::max(A.y, std::max(B.y, C.y));

    // iterating on bounding box
    for(int x = minX; x <= maxX; x++){
        for(int y = minY; y <= maxY; y++){
            P = Vec3f(x, y, 1);
            PA = Vec3f(
                    A.x - P.x,
                    A.y - P.y,
                    A.z - P.z
            );
            barycenter = getBarycentricCoordinates(AB, AC, PA);
            // checking if inside triangle and update z-buffer
            if(barycenter.x > 0 && barycenter.y > 0 && barycenter.z > 0){
                updateZBuffer(x, y, points, text, norms, barycenter, framebuffer, zBuffer);
            }
        }
    }
}